

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O0

void __thiscall rlottie::internal::renderer::CompLayer::updateContent(CompLayer *this)

{
  bool bVar1;
  Layer *in_RDI;
  Layer **layer;
  iterator __end1;
  iterator __begin1;
  vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
  *__range1;
  float alpha;
  int mappedFrame;
  Layer *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  int frameNo;
  Layer *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 uVar2;
  undefined1 local_88 [40];
  reference local_60;
  Layer **local_58;
  __normal_iterator<rlottie::internal::renderer::Layer_**,_std::vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>_>
  local_50;
  Layer *local_48;
  float local_3c;
  uint local_38;
  vFlag<rlottie::internal::renderer::DirtyFlagBit> local_c [3];
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
                      *)0x1609f5);
  uVar2 = false;
  if (bVar1) {
    local_c[0].i = (Int)Layer::flag(in_RDI);
    uVar2 = vFlag<rlottie::internal::renderer::DirtyFlagBit>::testFlag(local_c,Matrix);
  }
  if ((bool)uVar2 != false) {
    in_stack_ffffffffffffff60 =
         (Layer *)std::
                  unique_ptr<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
                  ::operator->((unique_ptr<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
                                *)0x160a43);
    Layer::combinedMatrix((Layer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    Clipper::update((Clipper *)CONCAT17(uVar2,in_stack_ffffffffffffff70),(VMatrix *)in_RDI);
  }
  frameNo = (int)((ulong)in_RDI->mLayerData >> 0x20);
  Layer::frameNo(in_RDI);
  local_38 = internal::model::Layer::timeRemap(in_stack_ffffffffffffff60,frameNo);
  local_3c = Layer::combinedAlpha(in_RDI);
  bVar1 = Layer::complexContent(in_RDI);
  if (bVar1) {
    local_3c = 1.0;
  }
  local_48 = in_RDI + 1;
  local_50._M_current =
       (Layer **)
       std::
       vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
       ::begin((vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
                *)in_stack_ffffffffffffff48);
  local_58 = (Layer **)
             std::
             vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
             ::end((vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
                    *)in_stack_ffffffffffffff48);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<rlottie::internal::renderer::Layer_**,_std::vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            (__normal_iterator<rlottie::internal::renderer::Layer_**,_std::vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>_>
                             *)in_stack_ffffffffffffff48), bVar1) {
    local_60 = __gnu_cxx::
               __normal_iterator<rlottie::internal::renderer::Layer_**,_std::vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>_>
               ::operator*(&local_50);
    in_stack_ffffffffffffff48 = *local_60;
    in_stack_ffffffffffffff54 = local_38;
    Layer::combinedMatrix((Layer *)CONCAT44(local_38,in_stack_ffffffffffffff50));
    (*in_stack_ffffffffffffff48->_vptr_Layer[2])
              (local_3c,in_stack_ffffffffffffff48,(ulong)in_stack_ffffffffffffff54,local_88);
    __gnu_cxx::
    __normal_iterator<rlottie::internal::renderer::Layer_**,_std::vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>_>
    ::operator++(&local_50);
  }
  return;
}

Assistant:

void renderer::CompLayer::updateContent()
{
    if (mClipper && flag().testFlag(DirtyFlagBit::Matrix)) {
        mClipper->update(combinedMatrix());
    }
    int   mappedFrame = mLayerData->timeRemap(frameNo());
    float alpha = combinedAlpha();
    if (complexContent()) alpha = 1;
    for (const auto &layer : mLayers) {
        layer->update(mappedFrame, combinedMatrix(), alpha);
    }
}